

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O1

void __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::WithinAbsMatcher
          (WithinAbsMatcher *this,string *msg,double target,double margin)

{
  pointer pcVar1;
  
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2
  ;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinAbsMatcher_002d5380;
  (this->m_msg)._M_dataplus._M_p = (pointer)&(this->m_msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_msg,pcVar1,pcVar1 + msg->_M_string_length);
  this->m_target = target;
  this->m_margin = margin;
  return;
}

Assistant:

WithinAbsMatcher::WithinAbsMatcher(std::string msg, double target, double margin)
        :m_msg{msg}, m_target{ target }, m_margin{ margin } {
    }